

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cc
# Opt level: O2

string * __thiscall
benchmark::ExponentToPrefix_abi_cxx11_
          (string *__return_storage_ptr__,benchmark *this,int64_t exponent,bool iec)

{
  benchmark __lhs;
  benchmark *pbVar1;
  undefined7 *puVar2;
  undefined1 *puVar3;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this != (benchmark *)0x0) {
    pbVar1 = (benchmark *)~(ulong)this;
    if (0 < (long)this) {
      pbVar1 = this + -1;
    }
    if ((long)pbVar1 < 9) {
      puVar3 = (anonymous_namespace)::kBigSIUnits;
      if ((char)exponent != '\0') {
        puVar3 = (undefined1 *)&(anonymous_namespace)::kBigIECUnits;
      }
      puVar2 = (undefined7 *)(anonymous_namespace)::kSmallSIUnits;
      if (0 < (long)this) {
        puVar2 = (undefined7 *)puVar3;
      }
      __lhs = pbVar1[(long)puVar2];
      if ((char)exponent != '\0') {
        std::__cxx11::string::string((string *)&local_38,"i",&local_39);
        std::operator+(__return_storage_ptr__,(char)__lhs,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        return __return_storage_ptr__;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x01');
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string ExponentToPrefix(int64_t exponent, bool iec) {
  if (exponent == 0) return "";

  const int64_t index = (exponent > 0 ? exponent - 1 : -exponent - 1);
  if (index >= kUnitsSize) return "";

  const char* array =
      (exponent > 0 ? (iec ? kBigIECUnits : kBigSIUnits) : kSmallSIUnits);
  if (iec)
    return array[index] + std::string("i");
  else
    return std::string(1, array[index]);
}